

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

bool __thiscall cmVSLink::Parse(cmVSLink *this,const_iterator argBeg,const_iterator argEnd)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  char *pcVar5;
  reference pbVar6;
  pointer pbVar7;
  byte local_1e5;
  bool local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  allocator local_1b1;
  value_type local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0 [32];
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  cmVSLink *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  const_iterator local_90;
  undefined4 local_84;
  string local_80 [48];
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  const_iterator arg;
  string intDir;
  cmVSLink *this_local;
  const_iterator argEnd_local;
  const_iterator argBeg_local;
  
  this_local = (cmVSLink *)argEnd._M_current;
  argEnd_local = argBeg;
  std::__cxx11::string::string((string *)&arg);
  local_50._M_current = argEnd_local._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&this_local);
    local_1e1 = false;
    if (bVar1) {
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_50);
      local_1e1 = cmHasLiteralPrefix<std::__cxx11::string,2ul>(pbVar6,(char (*) [2])0x9083e3);
    }
    if (local_1e1 == false) break;
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_50);
    bVar1 = std::operator==(pbVar6,"--");
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
      break;
    }
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_50);
    bVar1 = std::operator==(pbVar6,"--manifests");
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&local_50,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&this_local);
        local_1e5 = 0;
        if (bVar1) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_50);
          bVar1 = cmHasLiteralPrefix<std::__cxx11::string,2ul>(pbVar6,(char (*) [2])0x9083e3);
          local_1e5 = bVar1 ^ 0xff;
        }
        if ((local_1e5 & 1) == 0) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->UserManifests,pbVar6);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_50);
      }
    }
    else {
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_50);
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,10ul>(pbVar6,(char (*) [10])"--intdir=");
      if (!bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"unknown argument \'");
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_50);
        poVar3 = std::operator<<(poVar3,(string *)pbVar6);
        std::operator<<(poVar3,"\'\n");
        argBeg_local._M_current._7_1_ = false;
LAB_00438faf:
        local_84 = 1;
        std::__cxx11::string::~string((string *)&arg);
        return argBeg_local._M_current._7_1_;
      }
      pbVar7 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator->(&local_50);
      std::__cxx11::string::substr((ulong)local_80,(ulong)pbVar7);
      std::__cxx11::string::operator=((string *)&arg,local_80);
      std::__cxx11::string::~string(local_80);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar1 = __gnu_cxx::operator==
                      (&local_50,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&this_local);
    if (bVar1) {
      argBeg_local._M_current._7_1_ = false;
    }
    else {
      local_98._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->LinkCommand);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_90,&local_98);
      local_a0 = local_50._M_current;
      local_a8 = this_local;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                           ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            &this->LinkCommand,local_90,local_50,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )this_local);
      while (bVar1 = __gnu_cxx::operator!=
                               (&local_50,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&this_local), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_50);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        iVar2 = cmsys::SystemTools::Strucmp(pcVar5,"/INCREMENTAL:YES");
        if (iVar2 == 0) {
          this->Incremental = true;
        }
        else {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_50);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          iVar2 = cmsys::SystemTools::Strucmp(pcVar5,"/INCREMENTAL");
          if (iVar2 == 0) {
            this->Incremental = true;
          }
          else {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->(&local_50);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            iVar2 = cmsys::SystemTools::Strucmp(pcVar5,"/MANIFEST:NO");
            if (iVar2 == 0) {
              this->LinkGeneratesManifest = false;
            }
            else {
              pbVar6 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_50);
              bVar1 = cmHasLiteralPrefix<std::__cxx11::string,4ul>(pbVar6,(char (*) [4])"/Fe");
              if (bVar1) {
                pbVar7 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator->(&local_50);
                std::__cxx11::string::substr((ulong)local_d0,(ulong)pbVar7);
                std::__cxx11::string::operator=((string *)&this->TargetFile,local_d0);
                std::__cxx11::string::~string(local_d0);
              }
              else {
                pbVar6 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_50);
                bVar1 = cmHasLiteralPrefix<std::__cxx11::string,6ul>(pbVar6,(char (*) [6])"/out:");
                if (bVar1) {
                  pbVar7 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator->(&local_50);
                  std::__cxx11::string::substr((ulong)local_f0,(ulong)pbVar7);
                  std::__cxx11::string::operator=((string *)&this->TargetFile,local_f0);
                  std::__cxx11::string::~string(local_f0);
                }
              }
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_50);
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::operator+(&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                       "/embed.manifest");
        std::__cxx11::string::operator=((string *)&this->ManifestFile,(string *)&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::operator+(&local_130,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                       "/intermediate.manifest");
        std::__cxx11::string::operator=((string *)&this->LinkerManifestFile,(string *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        if ((this->Incremental & 1U) == 0) {
          bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&this->UserManifests);
          if (bVar1) {
            std::operator+(&local_190,&this->TargetFile,".manifest");
            std::__cxx11::string::operator=((string *)&this->ManifestFile,(string *)&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::operator=
                      ((string *)&this->LinkerManifestFile,(string *)&this->ManifestFile);
          }
        }
        else {
          std::operator+(&local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                         "/manifest.rc");
          std::__cxx11::string::operator=((string *)&this->ManifestFileRC,(string *)&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::operator+(&local_170,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                         "/manifest.res");
          std::__cxx11::string::operator=((string *)&this->ManifestFileRes,(string *)&local_170);
          std::__cxx11::string::~string((string *)&local_170);
        }
        if ((this->LinkGeneratesManifest & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1b0,"/MANIFEST",&local_1b1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->LinkCommand,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
          std::operator+(&local_1d8,"/MANIFESTFILE:",&this->LinkerManifestFile);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->LinkCommand,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
        }
        argBeg_local._M_current._7_1_ = true;
      }
      else {
        argBeg_local._M_current._7_1_ = false;
      }
    }
  }
  else {
    argBeg_local._M_current._7_1_ = false;
  }
  goto LAB_00438faf;
}

Assistant:

bool cmVSLink::Parse(std::vector<std::string>::const_iterator argBeg,
                     std::vector<std::string>::const_iterator argEnd)
{
  // Parse our own arguments.
  std::string intDir;
  std::vector<std::string>::const_iterator arg = argBeg;
  while (arg != argEnd && cmHasLiteralPrefix(*arg, "-"))
    {
    if (*arg == "--")
      {
      ++arg;
      break;
      }
    else if (*arg == "--manifests")
      {
      for (++arg; arg != argEnd && !cmHasLiteralPrefix(*arg, "-"); ++arg)
        {
        this->UserManifests.push_back(*arg);
        }
      }
    else if (cmHasLiteralPrefix(*arg, "--intdir="))
      {
      intDir = arg->substr(9);
      ++arg;
      }
    else
      {
      std::cerr << "unknown argument '" << *arg << "'\n";
      return false;
      }
    }
  if (intDir.empty())
    {
    return false;
    }

  // The rest of the arguments form the link command.
  if (arg == argEnd)
    {
    return false;
    }
  this->LinkCommand.insert(this->LinkCommand.begin(), arg, argEnd);

  // Parse the link command to extract information we need.
  for (; arg != argEnd; ++arg)
    {
    if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL:YES") == 0)
      {
      this->Incremental = true;
      }
    else if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL") == 0)
      {
      this->Incremental = true;
      }
    else if (cmSystemTools::Strucmp(arg->c_str(), "/MANIFEST:NO") == 0)
      {
      this->LinkGeneratesManifest = false;
      }
    else if (cmHasLiteralPrefix(*arg, "/Fe"))
      {
      this->TargetFile = arg->substr(3);
      }
    else if (cmHasLiteralPrefix(*arg, "/out:"))
      {
      this->TargetFile = arg->substr(5);
      }
    }

  if (this->TargetFile.empty())
    {
    return false;
    }

  this->ManifestFile = intDir + "/embed.manifest";
  this->LinkerManifestFile = intDir + "/intermediate.manifest";

  if (this->Incremental)
    {
    // We will compile a resource containing the manifest and
    // pass it to the link command.
    this->ManifestFileRC = intDir + "/manifest.rc";
    this->ManifestFileRes = intDir + "/manifest.res";
    }
  else if (this->UserManifests.empty())
    {
    // Prior to support for user-specified manifests CMake placed the
    // linker-generated manifest next to the binary (as if it were not to be
    // embedded) when not linking incrementally.  Preserve this behavior.
    this->ManifestFile = this->TargetFile + ".manifest";
    this->LinkerManifestFile = this->ManifestFile;
    }

  if (this->LinkGeneratesManifest)
    {
    this->LinkCommand.push_back("/MANIFEST");
    this->LinkCommand.push_back("/MANIFESTFILE:" + this->LinkerManifestFile);
    }

  return true;
}